

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v7::
     format_to_n<char*,char[10],std::basic_string_view<char,std::char_traits<char>>,unsigned_long,true>
               (char *out,size_t n,char (*format_str) [10],
               basic_string_view<char,_std::char_traits<char>_> *args,unsigned_long *args_1)

{
  char (*n_00) [10];
  size_t out_00;
  format_to_n_result<char_*> fVar1;
  type tVar2;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *vargs;
  unsigned_long *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char (*format_str_local) [10];
  size_t n_local;
  char *out_local;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
           *)args_1;
  args_local_1 = &args->_M_len;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)format_str;
  format_str_local = (char (*) [10])n;
  n_local = (size_t)out;
  make_args_checked<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,char[10],char>
            (&local_88,(v7 *)format_str,(char (*) [10])args,
             (remove_reference_t<std::basic_string_view<char>_> *)args_1,args_1);
  out_00 = n_local;
  n_00 = format_str_local;
  local_60 = &local_88;
  local_98 = to_string_view<char,_0>((char *)args_local);
  local_18 = &local_a8;
  local_20 = local_60;
  local_10 = local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_18,0x4d,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_60);
  fVar1 = vformat_to_n<char_*,_char,_0>((char *)out_00,(size_t)n_00,local_98,local_a8);
  tVar2.out = fVar1.out;
  tVar2.size = fVar1.size;
  return tVar2;
}

Assistant:

inline auto format_to_n(OutputIt out, size_t n, const S& format_str,
                        const Args&... args) ->
    typename std::enable_if<enable, format_to_n_result<OutputIt>>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to_n(out, n, to_string_view(format_str), vargs);
}